

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::CompoundStmt> __thiscall
mocker::Parser::compoundStmt(Parser *this,TokIter *iter,TokIter end)

{
  Token *this_00;
  Position end_00;
  Position beg;
  TokIter TVar1;
  TokenID TVar2;
  CompileError *this_01;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<mocker::ast::CompoundStmt> sVar4;
  Position beg_00;
  Position end_01;
  shared_ptr<mocker::ast::Statement> stmt;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  stmts;
  Parser local_80;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  *local_68;
  Token *local_60;
  Token *local_58;
  element_type *local_50;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  local_48;
  
  Token::position(*end._M_current);
  local_58 = local_80.tokEnd._M_current;
  local_60 = local_80.tokBeg._M_current;
  _Var3._M_pi = extraout_RDX;
  if (*end._M_current != in_RCX) {
    TVar2 = Token::tokenID(*end._M_current);
    _Var3._M_pi = extraout_RDX_00;
    if (TVar2 == LeftBrace) {
      *(long *)end._M_current = *(long *)end._M_current + 0x38;
      local_48.
      super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50 = (element_type *)this;
      do {
        statement(&local_80,iter,end);
        TVar1._M_current = local_80.tokBeg._M_current;
        if (local_80.tokBeg._M_current != (Token *)0x0) {
          std::
          vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>
          ::emplace_back<std::shared_ptr<mocker::ast::Statement>>
                    ((vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>
                      *)&local_48,(shared_ptr<mocker::ast::Statement> *)&local_80);
        }
        if (local_80.tokEnd._M_current != (Token *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.tokEnd._M_current);
        }
      } while (TVar1._M_current != (Token *)0x0);
      if (*end._M_current == in_RCX) {
        TVar2 = Error;
      }
      else {
        TVar2 = Token::tokenID(*end._M_current);
      }
      this = (Parser *)local_50;
      if (TVar2 != RightBrace) {
        this_01 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        end_00.col = (size_t)local_68;
        end_00.line = (size_t)local_80.pos;
        beg.col = (size_t)local_58;
        beg.line = (size_t)local_60;
        CompileError::CompileError(this_01,beg,end_00);
        *(undefined ***)this_01 = &PTR__CompileError_001f2a98;
        __cxa_throw(this_01,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      this_00 = *end._M_current;
      *(Token **)end._M_current = this_00 + 1;
      Token::position(this_00);
      beg_00.col = (size_t)local_60;
      beg_00.line = (size_t)iter;
      end_01.col = (size_t)local_80.pos;
      end_01.line = (size_t)local_58;
      makeNode<mocker::ast::CompoundStmt,std::vector<std::shared_ptr<mocker::ast::Statement>,std::allocator<std::shared_ptr<mocker::ast::Statement>>>>
                (this,beg_00,end_01,local_68);
      std::
      vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
      ::~vector(&local_48);
      _Var3._M_pi = extraout_RDX_01;
      goto LAB_00182a05;
    }
  }
  (this->tokBeg)._M_current = (Token *)0x0;
  (this->tokEnd)._M_current = (Token *)0x0;
LAB_00182a05:
  sVar4.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar4.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::CompoundStmt>)
         sVar4.super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::CompoundStmt> Parser::compoundStmt(TokIter &iter,
                                                        TokIter end) {
  auto begPos = iter->position().first;
  auto id = GetTokenID(end);

  if (id(iter) != TokenID::LeftBrace)
    return nullptr;
  ++iter;
  std::vector<std::shared_ptr<ast::Statement>> stmts;
  while (auto stmt = statement(iter, end))
    stmts.emplace_back(std::move(stmt));
  if (id(iter) != TokenID::RightBrace)
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::CompoundStmt>(begPos, (iter++)->position().second,
                                     std::move(stmts));
}